

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

bool __thiscall App::get_output_filename(App *this)

{
  DynamicFormat *pDVar1;
  size_type sVar2;
  long lVar3;
  string_view name;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  undefined1 auVar4 [16];
  allocator_type local_1b2;
  allocator<char> local_1b1;
  allocator<char> local_1b0;
  allocator<char> local_1af;
  allocator<char> local_1ae;
  allocator<char> local_1ad;
  allocator<char> local_1ac;
  allocator<char> local_1ab;
  allocator<char> local_1aa;
  allocator<char> local_1a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  file_dialog local_188;
  string results;
  string guessed_output_name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_138;
  string extension;
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  string local_40 [32];
  
  auVar4 = (**(code **)(*(long *)this->input_format + 8))();
  name._M_str = auVar4._8_8_;
  name._M_len = (size_t)name._M_str;
  pDVar1 = ritobin::io::DynamicFormat::get(auVar4._0_8_,name);
  guessed_output_name._M_dataplus._M_p = (pointer)&guessed_output_name.field_2;
  guessed_output_name._M_string_length = 0;
  guessed_output_name.field_2._M_local_buf[0] = '\0';
  if (pDVar1 != (DynamicFormat *)0x0) {
    results._0_16_ = (**(code **)(*(long *)pDVar1 + 0x10))(pDVar1);
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&extension,(basic_string_view<char,_std::char_traits<char>_> *)&results,
               (allocator<char> *)&local_1a8);
    if (extension._M_string_length != 0) {
      sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              find_last_of(&this->input_filename,".",0xffffffffffffffff);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_1a8,&this->input_filename,0,sVar2);
      std::operator+(&results,&local_1a8,&extension);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&guessed_output_name,&results);
      std::__cxx11::string::~string((string *)&results);
      std::__cxx11::string::~string((string *)&local_1a8);
    }
    std::__cxx11::string::~string((string *)&extension);
  }
  printf("Guessed name: %s\n",guessed_output_name._M_dataplus._M_p);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a8,"ritobin output file",&local_1a9);
  std::__cxx11::string::string<std::allocator<char>>((string *)&extension,"All Files",&local_1aa);
  std::__cxx11::string::string<std::allocator<char>>(local_100,"*",&local_1ab);
  std::__cxx11::string::string<std::allocator<char>>(local_e0,"bin files",&local_1ac);
  std::__cxx11::string::string<std::allocator<char>>(local_c0,"*.bin",&local_1ad);
  std::__cxx11::string::string<std::allocator<char>>(local_a0,"text files",&local_1ae);
  std::__cxx11::string::string<std::allocator<char>>(local_80,"*.txt *.py",&local_1af);
  std::__cxx11::string::string<std::allocator<char>>(local_60,"json files",&local_1b0);
  std::__cxx11::string::string<std::allocator<char>>(local_40,"*.json",&local_1b1);
  __l._M_len = 8;
  __l._M_array = &extension;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_138,__l,&local_1b2);
  pfd::save_file::save_file
            ((save_file *)&local_188,&local_1a8,&guessed_output_name,&local_138,force_overwrite);
  pfd::internal::file_dialog::string_result_abi_cxx11_(&results,&local_188);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_188.super_dialog.m_async.
              super___shared_ptr<pfd::internal::executor,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_138);
  lVar3 = 0xe0;
  do {
    std::__cxx11::string::~string(local_100 + lVar3 + -0x20);
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x20);
  std::__cxx11::string::~string((string *)&local_1a8);
  sVar2 = results._M_string_length;
  if (results._M_string_length == 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
              (&this->output_filename,"");
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&this->output_filename,&results);
  }
  std::__cxx11::string::~string((string *)&results);
  std::__cxx11::string::~string((string *)&guessed_output_name);
  return sVar2 != 0;
}

Assistant:

bool get_output_filename() {
        DynamicFormat const* guessed_output_format = DynamicFormat::get(input_format->oposite_name());
        std::string guessed_output_name = {};
        if (guessed_output_format) {
            std::string extension = std::string(guessed_output_format->default_extension());
            if (!extension.empty()) {
                auto const dot = input_filename.find_last_of(".");
                guessed_output_name = input_filename.substr(0, dot) + extension;
            }
        }
        printf("Guessed name: %s\n", guessed_output_name.c_str());
        auto results = pfd::save_file("ritobin output file", guessed_output_name,
                                      {
                                          "All Files", "*",
                                          "bin files", "*.bin",
                                          "text files", "*.txt *.py",
                                          "json files", "*.json",
                                      }, pfd::opt::force_overwrite).result();
        if (results.empty()) {
            output_filename = "";
            return false;
        }
        output_filename = std::move(results);
        return true;
    }